

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

void __thiscall
DomStringPropertySpecification::~DomStringPropertySpecification
          (DomStringPropertySpecification *this)

{
  QString::~QString((QString *)0x1c6ca0);
  QString::~QString((QString *)0x1c6cae);
  QString::~QString((QString *)0x1c6cb8);
  return;
}

Assistant:

DomStringPropertySpecification::~DomStringPropertySpecification() = default;